

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O0

uint32_t helper_uqsub8_aarch64(uint32_t a,uint32_t b)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint32_t res;
  uint32_t b_local;
  uint32_t a_local;
  
  uVar1 = sub8_usat((uint8_t)a,(uint8_t)b);
  uVar2 = sub8_usat((uint8_t)(a >> 8),(uint8_t)(b >> 8));
  uVar3 = sub8_usat((uint8_t)(a >> 0x10),(uint8_t)(b >> 0x10));
  uVar4 = sub8_usat((uint8_t)(a >> 0x18),(uint8_t)(b >> 0x18));
  return CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

uint32_t HELPER(glue(PFX,sub8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    SUB8(a, b, 0);
    SUB8(a >> 8, b >> 8, 1);
    SUB8(a >> 16, b >> 16, 2);
    SUB8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}